

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O3

void AudioCallbackWrapper(void *userdata,Uint8 *stream,int len)

{
  drmp3 *pMP3;
  byte bVar1;
  undefined1 uVar2;
  ushort uVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  SDL_bool SVar9;
  drmp3_uint64 dVar10;
  size_t sVar11;
  ulong uVar12;
  
  if ((*(int *)((long)userdata + 0x20) != 0) &&
     (iVar7 = (*SDL20_AtomicGet)(&audio_callback_paused), iVar7 == 0)) {
    do {
      iVar7 = (*SDL20_AudioStreamAvailable)(*(SDL_AudioStream **)((long)userdata + 0x48));
      if (len <= iVar7) break;
      (*SDL20_memset)(*(void **)((long)userdata + 0x3f58),
                      (int)*(undefined1 *)((long)userdata + 0x2f),
                      (size_t)*(undefined4 *)((long)userdata + 0x34));
      (**(code **)((long)userdata + 0x38))
                (*(undefined8 *)((long)userdata + 0x40),*(undefined8 *)((long)userdata + 0x3f58),
                 *(undefined4 *)((long)userdata + 0x34));
      iVar7 = (*SDL20_AudioStreamPut)
                        (*(SDL_AudioStream **)((long)userdata + 0x48),
                         *(void **)((long)userdata + 0x3f58),*(int *)((long)userdata + 0x34));
    } while (iVar7 != -1);
    iVar7 = (*SDL20_AudioStreamGet)(*(SDL_AudioStream **)((long)userdata + 0x48),stream,len);
    if (iVar7 == len) {
      bVar6 = true;
      bVar5 = false;
      goto LAB_00117939;
    }
    (*SDL20_memset)(stream,(int)*(undefined1 *)((long)userdata + 7),(long)len);
  }
  bVar5 = true;
  bVar6 = false;
LAB_00117939:
  if (*(int *)((long)userdata + 0x80) == 2) {
    pMP3 = (drmp3 *)((long)userdata + 0x98);
    do {
      bVar1 = *(byte *)((long)userdata + 0x5e);
      uVar3 = *(ushort *)((long)userdata + 0x60);
      do {
        if (((*(byte *)((long)userdata + 0x3f38) & 1) != 0) ||
           (iVar7 = (*SDL20_AudioStreamAvailable)(*(SDL_AudioStream **)((long)userdata + 0x78)),
           len <= iVar7)) goto LAB_001179c6;
        dVar10 = drmp3_read_pcm_frames_f32
                           (pMP3,(ulong)(ushort)(uVar3 / bVar1),*(float **)((long)userdata + 0x3f58)
                           );
        iVar7 = (int)dVar10 * (uint)(ushort)bVar1 * 4;
      } while ((iVar7 != 0) &&
              (iVar7 = (*SDL20_AudioStreamPut)
                                 (*(SDL_AudioStream **)((long)userdata + 0x78),
                                  *(void **)((long)userdata + 0x3f58),iVar7), iVar7 != -1));
      *(byte *)((long)userdata + 0x3f38) = *(byte *)((long)userdata + 0x3f38) | 1;
      (*SDL20_AudioStreamFlush)(*(SDL_AudioStream **)((long)userdata + 0x78));
LAB_001179c6:
      uVar8 = (*SDL20_AudioStreamAvailable)(*(SDL_AudioStream **)((long)userdata + 0x78));
      uVar4 = len;
      if (uVar8 < (uint)len) {
        uVar4 = uVar8;
      }
      uVar12 = (ulong)uVar4;
      if (uVar4 != 0) {
        if (bVar5) {
          (*SDL20_AudioStreamGet)(*(SDL_AudioStream **)((long)userdata + 0x78),stream,uVar4);
        }
        else {
          (*SDL20_AudioStreamGet)
                    (*(SDL_AudioStream **)((long)userdata + 0x78),
                     *(void **)((long)userdata + 0x3f58),uVar4);
          (*SDL20_MixAudioFormat)
                    (stream,*(Uint8 **)((long)userdata + 0x3f58),
                     (audio_cbdata->device_format).format,uVar4,0x80);
        }
        iVar7 = (int)(((double)uVar12 / ((double)*(byte *)((long)userdata + 4) * 0.125)) /
                     (double)*(byte *)((long)userdata + 6)) + *(int *)((long)userdata + 0x84);
        *(int *)((long)userdata + 0x84) = iVar7;
        iVar7 = (int)(((double)iVar7 / (double)*userdata) * 75.0);
        *(int *)((long)userdata + 0x8c) = iVar7;
        if ((*(int *)((long)userdata + 0x90) == 0) && (*(int *)((long)userdata + 0x94) <= iVar7)) {
          *(byte *)((long)userdata + 0x3f38) = *(byte *)((long)userdata + 0x3f38) | 1;
        }
      }
      if (uVar8 != 0) {
        return;
      }
      if ((*(byte *)((long)userdata + 0x3f38) & 1) == 0) {
        return;
      }
      FreeMp3(pMP3);
      if (*(int *)((long)userdata + 0x90) < 1) {
LAB_00117b4e:
        *(undefined4 *)((long)userdata + 0x80) = 1;
LAB_00117b59:
        if (bVar6 || len == 0) {
          return;
        }
        stream = stream + uVar12;
        uVar2 = *(undefined1 *)((long)userdata + 7);
        sVar11 = (size_t)(len - uVar4);
        goto LAB_00117b8e;
      }
      *(int *)((long)userdata + 0x90) = *(int *)((long)userdata + 0x90) + -1;
      *(undefined4 *)((long)userdata + 0x84) = 0;
      *(undefined4 *)((long)userdata + 0x8c) = 0;
      if (*(int *)((long)userdata + 0x80) != 2) goto LAB_00117b59;
      iVar7 = *(int *)((long)userdata + 0x88) + 1;
      *(int *)((long)userdata + 0x88) = iVar7;
      SVar9 = LoadCDTrack(iVar7,pMP3);
      if (SVar9 == SDL_FALSE) goto LAB_00117b4e;
      if (len == 0) {
        return;
      }
      stream = stream + uVar12;
      len = len - uVar4;
    } while (*(int *)((long)userdata + 0x80) == 2);
  }
  if (!bVar5) {
    return;
  }
  uVar2 = *(undefined1 *)((long)userdata + 7);
  sVar11 = (size_t)len;
LAB_00117b8e:
  (*SDL20_memset)(stream,(int)uVar2,sVar11);
  return;
}

Assistant:

static void SDLCALL
AudioCallbackWrapper(void *userdata, Uint8 *stream, int len)
{
    AudioCallbackWrapperData *data = (AudioCallbackWrapperData *) userdata;
    SDL_bool must_mix = SDL_FALSE;

    if (data->app_callback_opened && !SDL20_AtomicGet(&audio_callback_paused)) {
        while (SDL20_AudioStreamAvailable(data->app_callback_stream) < len) {
            SDL20_memset(data->mix_buffer, data->app_callback_format.silence, data->app_callback_format.size);  /* SDL2 doesn't clear the stream before calling in here, but 1.2 expects it. */
            data->app_callback_format.callback(data->app_callback_format.userdata, data->mix_buffer, data->app_callback_format.size);
            if (SDL20_AudioStreamPut(data->app_callback_stream, data->mix_buffer, data->app_callback_format.size) == -1) {  /* probably out of memory if failed */
                break;  /* this will make the AudioStreamGet call fail. */
            }
        }
        if (SDL20_AudioStreamGet(data->app_callback_stream, stream, len) != len) {
            SDL20_memset(stream, data->device_format.silence, len);
        } else {
            must_mix = SDL_TRUE;
        }
    }

    FakeCdRomAudioCallback(data, stream, len, must_mix);
}